

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O3

ProfileHandlerToken * __thiscall
ProfileHandler::RegisterCallback
          (ProfileHandler *this,ProfileHandlerCallback callback,void *callback_arg)

{
  unsigned_long *puVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  undefined8 *p;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  bool bVar6;
  undefined1 local_d8 [8];
  ScopedSignalBlocker block;
  CallbackList copy;
  SpinLockHolder sl;
  SpinLockHolder cl;
  
  p_Var4 = (_List_node_base *)operator_new(0x10);
  p_Var4->_M_next = (_List_node_base *)callback;
  p_Var4->_M_prev = (_List_node_base *)callback_arg;
  block.sig_set_.__val[0xf] = (unsigned_long)(block.sig_set_.__val + 0xf);
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)block.sig_set_.__val[0xf];
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = p_Var4;
  puVar1 = block.sig_set_.__val + 0xf;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       (_List_node_base *)
       ((long)&(copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>
                ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
  sl.lock_ = &this->control_lock_;
  LOCK();
  bVar6 = (this->control_lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar6) {
    (this->control_lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar6) {
    SpinLock::SlowLock(sl.lock_);
  }
  ScopedSignalBlocker::ScopedSignalBlocker((ScopedSignalBlocker *)local_d8,this->signal_number_);
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node._M_size = (size_t)&this->signal_lock_;
  LOCK();
  bVar6 = (this->signal_lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar6) {
    (this->signal_lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar6) {
    SpinLock::SlowLock((SpinLock *)
                       copy.
                       super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>
                       ._M_impl._M_node._M_size);
  }
  if ((unsigned_long *)block.sig_set_.__val[0xf] != puVar1) {
    std::__detail::_List_node_base::_M_transfer
              ((_List_node_base *)&this->callbacks_,(_List_node_base *)block.sig_set_.__val[0xf]);
    psVar2 = &(this->callbacks_).
              super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
              _M_impl._M_node._M_size;
    *psVar2 = (long)&(copy.
                      super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>
                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + *psVar2;
    copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  }
  SpinLockHolder::~SpinLockHolder
            ((SpinLockHolder *)
             &copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
              _M_impl._M_node._M_size);
  ScopedSignalBlocker::~ScopedSignalBlocker((ScopedSignalBlocker *)local_d8);
  this->callback_count_ = this->callback_count_ + 1;
  UpdateTimer(this,true);
  SpinLockHolder::~SpinLockHolder(&sl);
  p = (undefined8 *)block.sig_set_.__val[0xf];
  while (p != puVar1) {
    puVar3 = (undefined8 *)*p;
    operator_delete(p,0x18);
    p = puVar3;
  }
  return (ProfileHandlerToken *)p_Var4;
}

Assistant:

ProfileHandlerToken* ProfileHandler::RegisterCallback(
    ProfileHandlerCallback callback, void* callback_arg) {

  ProfileHandlerToken* token = new ProfileHandlerToken(callback, callback_arg);
  CallbackList copy;
  copy.push_back(token);

  SpinLockHolder cl(&control_lock_);
  {
    ScopedSignalBlocker block(signal_number_);
    SpinLockHolder sl(&signal_lock_);
    callbacks_.splice(callbacks_.end(), copy);
  }

  ++callback_count_;
  UpdateTimer(true);
  return token;
}